

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

parser_error parse_trap_effect_xtra(parser *p)

{
  void *pvVar1;
  effect *effect_00;
  effect *new_effect;
  effect *effect;
  trap_kind *t;
  parser *p_local;
  
  pvVar1 = parser_priv(p);
  if (pvVar1 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    effect_00 = (effect *)mem_zalloc(0x38);
    if (*(long *)((long)pvVar1 + 0x78) == 0) {
      *(effect **)((long)pvVar1 + 0x78) = effect_00;
    }
    else {
      for (new_effect = *(effect **)((long)pvVar1 + 0x78); new_effect->next != (effect *)0x0;
          new_effect = new_effect->next) {
      }
      new_effect->next = effect_00;
    }
    p_local._4_4_ = grab_effect_data(p,effect_00);
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_trap_effect_xtra(struct parser *p) {
	struct trap_kind *t = parser_priv(p);
	struct effect *effect, *new_effect;

	if (!t) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	/* Go to the next vacant effect and set it to the new one  */
	new_effect = mem_zalloc(sizeof(*new_effect));
	if (t->effect_xtra) {
		effect = t->effect_xtra;
		while (effect->next) effect = effect->next;
		effect->next = new_effect;
	} else {
		t->effect_xtra = new_effect;
	}
	/* Fill in the detail */
	return grab_effect_data(p, new_effect);
}